

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_util.cpp
# Opt level: O0

bool duckdb::ExpressionUtil::
     ExpressionSetEquals<duckdb::ParsedExpression,_std::unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>_>
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *a,vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   *b)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *in_RSI;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *in_RDI;
  iterator entry;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  idx_t i;
  unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
  map;
  unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff08;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_true>
  in_stack_ffffffffffffff10;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_true>
  local_a8;
  undefined1 local_a0 [32];
  __normal_iterator<const_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_80;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *local_78;
  ulong local_58;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *local_18;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar3 = ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::size(in_RDI);
  sVar4 = ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::size(local_18);
  if (sVar3 == sVar4) {
    ::std::
    unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
    ::unordered_map((unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
                     *)0x2a2517d);
    local_58 = 0;
    while( true ) {
      uVar1 = local_58;
      sVar3 = ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ::size(local_10);
      if (sVar3 <= uVar1) break;
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)in_stack_ffffffffffffff10._M_cur,(size_type)in_stack_ffffffffffffff08);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_ffffffffffffff10._M_cur);
      ::std::reference_wrapper<duckdb::ParsedExpression>::
      reference_wrapper<duckdb::ParsedExpression_&,_void,_duckdb::ParsedExpression_*>
                ((reference_wrapper<duckdb::ParsedExpression> *)in_stack_ffffffffffffff10._M_cur,
                 (ParsedExpression *)in_stack_ffffffffffffff08);
      pmVar5 = ::std::
               unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
               ::operator[]((unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
                             *)in_stack_ffffffffffffff10._M_cur,
                            (key_type *)in_stack_ffffffffffffff08);
      *pmVar5 = *pmVar5 + 1;
      local_58 = local_58 + 1;
    }
    local_78 = local_18;
    local_80._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_ffffffffffffff08);
    local_a0._24_8_ =
         ::std::
         vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                *)in_stack_ffffffffffffff08);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator!=<const_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                        ((__normal_iterator<const_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                          *)in_stack_ffffffffffffff10._M_cur,
                         (__normal_iterator<const_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar2) break;
      local_a0._16_8_ =
           __gnu_cxx::
           __normal_iterator<const_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
           ::operator*(&local_80);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)in_stack_ffffffffffffff10._M_cur);
      in_stack_ffffffffffffff08 =
           (unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
            *)local_a0;
      ::std::reference_wrapper<duckdb::ParsedExpression>::
      reference_wrapper<duckdb::ParsedExpression_&,_void,_duckdb::ParsedExpression_*>
                ((reference_wrapper<duckdb::ParsedExpression> *)in_stack_ffffffffffffff10._M_cur,
                 (ParsedExpression *)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff10._M_cur =
           (__node_type *)
           ::std::
           unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
           ::find(in_stack_ffffffffffffff08,(key_type *)0x2a252ef);
      local_a0._8_8_ = in_stack_ffffffffffffff10._M_cur;
      local_a8._M_cur =
           (__node_type *)
           ::std::
           unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
           ::end(in_stack_ffffffffffffff08);
      bVar2 = ::std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_true>
                          *)(local_a0 + 8),&local_a8);
      if (bVar2) {
        local_1 = 0;
        goto LAB_02a25391;
      }
      ppVar6 = ::std::__detail::
               _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_false,_true>
                             *)0x2a25343);
      if (ppVar6->second == 0) {
        local_1 = 0;
        goto LAB_02a25391;
      }
      ppVar6 = ::std::__detail::
               _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_false,_true>
                             *)0x2a25366);
      ppVar6->second = ppVar6->second - 1;
      __gnu_cxx::
      __normal_iterator<const_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&local_80);
    }
    local_1 = 1;
LAB_02a25391:
    ::std::
    unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>_>
                      *)0x2a2539e);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ExpressionUtil::ExpressionSetEquals(const vector<unique_ptr<T>> &a, const vector<unique_ptr<T>> &b) {
	if (a.size() != b.size()) {
		return false;
	}
	// we create a map of expression -> count for the left side
	// we keep the count because the same expression can occur multiple times (e.g. "1 AND 1" is legal)
	// in this case we track the following value: map["Constant(1)"] = 2
	EXPRESSION_MAP map;
	for (idx_t i = 0; i < a.size(); i++) {
		map[*a[i]]++;
	}
	// now on the right side we reduce the counts again
	// if the conjunctions are identical, all the counts will be 0 after the
	for (auto &expr : b) {
		auto entry = map.find(*expr);
		// first we check if we can find the expression in the map at all
		if (entry == map.end()) {
			return false;
		}
		// if we found it we check the count; if the count is already 0 we return false
		// this happens if e.g. the left side contains "1 AND X", and the right side contains "1 AND 1"
		// "1" is contained in the map, however, the right side contains the expression twice
		// hence we know the children are not identical in this case because the LHS and RHS have a different count for
		// the Constant(1) expression
		if (entry->second == 0) {
			return false;
		}
		entry->second--;
	}
	return true;
}